

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

Var Js::JavascriptArray::EntryPushJavascriptArrayNoFastPath
              (ScriptContext *scriptContext,JavascriptArray *arr,Var *args,uint argCount)

{
  code *pcVar1;
  double value;
  int iVar2;
  int iVar3;
  BOOL BVar4;
  uint64 uVar5;
  uint64 uVar6;
  undefined4 *puVar7;
  Var pvVar8;
  ulong uVar9;
  Type initIndex;
  bool bVar10;
  undefined1 local_78 [8];
  JsReentLock jsReentLock;
  BigIndex big;
  
  local_78 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_78)->noJsReentrancy;
  ((ThreadContext *)local_78)->noJsReentrancy = true;
  JsReentLock::setObjectForMutation((JsReentLock *)local_78,arr);
  initIndex = (arr->super_ArrayObject).length;
  bVar10 = argCount != 0;
  if (initIndex == 0xffffffff || !bVar10) {
    uVar9 = 0;
  }
  else {
    uVar9 = 0;
    do {
      iVar2 = (int)uVar9;
      iVar3 = (*(arr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x29])(arr,(ulong)(iVar2 + initIndex),args[uVar9],0);
      if (iVar3 == 0) {
        JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fe43,L"Array.prototype.push");
      }
      uVar9 = uVar9 + 1;
      bVar10 = uVar9 < argCount;
    } while ((bVar10) && (iVar2 + initIndex != -2));
    initIndex = initIndex + (int)uVar9;
  }
  if (bVar10) {
    EnsureNonNativeArray(arr);
    if (initIndex != 0xffffffff) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar10 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                   ,0x154e,"(n == JavascriptArray::MaxArrayLength)",
                                   "n == JavascriptArray::MaxArrayLength");
      if (!bVar10) {
LAB_00b87813:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar7 = 0;
    }
    BigIndex::BigIndex((BigIndex *)&jsReentLock.m_savedNoJsReentrancy,initIndex);
    if ((uint)uVar9 < argCount) {
      uVar9 = uVar9 & 0xffffffff;
      do {
        *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        BVar4 = BigIndex::SetItem((BigIndex *)&jsReentLock.m_savedNoJsReentrancy,arr,args[uVar9]);
        if (BVar4 == 0) {
          JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fe43,L"Array.prototype.push");
        }
        JsReentLock::MutateArrayObject((JsReentLock *)local_78);
        *(bool *)((long)local_78 + 0x108) = true;
        if (jsReentLock._24_4_ != -1) {
          jsReentLock._24_4_ = jsReentLock._24_4_ + 1;
        }
        uVar9 = uVar9 + 1;
      } while (argCount != uVar9);
    }
    (*(arr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])(arr);
    JavascriptError::ThrowRangeError(scriptContext,-0x7ff5ec5a,(PCWSTR)0x0);
  }
  (*(arr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])(arr);
  if ((int)initIndex < 0) {
    value = (double)initIndex;
    uVar5 = NumberUtilities::ToSpecial(value);
    bVar10 = NumberUtilities::IsNan(value);
    if (((bVar10) && (uVar6 = NumberUtilities::ToSpecial(value), uVar6 != 0xfff8000000000000)) &&
       (uVar6 = NumberUtilities::ToSpecial(value), uVar6 != 0x7ff8000000000000)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar10 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                   ,0xa2,
                                   "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                   ,"We should only produce a NaN with this value");
      if (!bVar10) goto LAB_00b87813;
      *puVar7 = 0;
    }
    pvVar8 = (Var)(uVar5 ^ 0xfffc000000000000);
  }
  else {
    pvVar8 = (Var)((ulong)initIndex | 0x1000000000000);
  }
  *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return pvVar8;
}

Assistant:

Var JavascriptArray::EntryPushJavascriptArrayNoFastPath(ScriptContext * scriptContext, JavascriptArray* arr, Var * args, uint argCount)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, arr);

        uint n = arr->length;
        ThrowTypeErrorOnFailureHelper h(scriptContext, _u("Array.prototype.push"));

        // First handle "small" indices.
        uint index;
        for (index = 0; index < argCount && n < JavascriptArray::MaxArrayLength; ++index, ++n)
        {
            // Set Item is overridden by CrossSiteObject, so no need to check for IsCrossSiteObject()
            h.ThrowTypeErrorOnFailure(arr->SetItem(n, args[index], PropertyOperation_None));
        }

        // Use BigIndex if we need to push indices >= MaxArrayLength
        if (index < argCount)
        {
            // Not supporting native array with BigIndex.
            arr = EnsureNonNativeArray(arr);
            Assert(n == JavascriptArray::MaxArrayLength);
            for (BigIndex big = n; index < argCount; ++index, ++big)
            {
                JS_REENTRANT(jsReentLock, h.ThrowTypeErrorOnFailure(big.SetItem(arr, args[index])));
            }

#ifdef VALIDATE_ARRAY
            arr->ValidateArray();
#endif
            // This is where we should set the length, but for arrays it cannot be >= MaxArrayLength
            JavascriptError::ThrowRangeError(scriptContext, JSERR_ArrayLengthAssignIncorrect);
        }

#ifdef VALIDATE_ARRAY
        arr->ValidateArray();
#endif
        return JavascriptNumber::ToVar(n, scriptContext);
    }